

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linked-list.cpp
# Opt level: O3

void __thiscall LinkedList::insert(LinkedList *this,Node **head,int newNumber,int beforeNumber)

{
  Node *pNVar1;
  Node *pNVar2;
  
  pNVar2 = *head;
  if (pNVar2 == (Node *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Empty Linked List",0x11);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
    return;
  }
  do {
    if (pNVar2->data == beforeNumber) {
      pNVar1 = (Node *)operator_new(0x10);
      *(undefined8 *)pNVar1 = 0;
      pNVar1->next = (Node *)0x0;
      pNVar1->data = newNumber;
      pNVar1->next = pNVar2->next;
      pNVar2->next = pNVar1;
      if (beforeNumber != newNumber) goto LAB_00101b97;
    }
    else {
LAB_00101b97:
      pNVar1 = pNVar2;
    }
    pNVar2 = pNVar1->next;
    if (pNVar2 == (Node *)0x0) {
      return;
    }
  } while( true );
}

Assistant:

void LinkedList::insert(Node** head, int newNumber, int beforeNumber) {
	Node* last = *head;

	if (last == nullptr) {
		std::cout << "Empty Linked List" << std::endl;
		return;
	}

	while (true) {
		if (last == nullptr) {
			break;
		}
		
		if (last->data == beforeNumber) {
			Node* newNode = new Node();
			newNode->data = newNumber;

			if (last->next == nullptr) {
				newNode->next = nullptr;
			} else {
				newNode->next = last->next;
			}

			last->next = newNode;

			if (beforeNumber == newNumber) {
				last = last->next->next;
				continue;
			}
		}
		
		last = last->next;
	}
}